

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

float * __thiscall
TPZBlockDiagonal<float>::operator()(TPZBlockDiagonal<float> *this,int64_t row,int64_t col)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = (this->fBlockSize).fNElements;
  if (lVar1 == 0) {
    std::operator<<((ostream *)&std::cout,
                    "TPZBlockDiagonal::operator() called with parameters out of range\n");
    pfVar3 = &operator()::zero;
  }
  else {
    lVar2 = 0;
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar5 = lVar2;
      lVar4 = (long)(this->fBlockSize).fStore[lVar5];
      lVar7 = lVar6 + lVar4;
      if (lVar1 <= lVar5) break;
      lVar2 = lVar5 + 1;
    } while (lVar7 <= row);
    if (lVar1 + 1 == lVar5 + 1) {
      std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::operator() wrong data structure\n");
      pfVar3 = &operator()(long,long)::zero;
    }
    else if (col < lVar6 || lVar7 <= col) {
      std::operator<<((ostream *)&std::cout,
                      "TPZBlockDiagonal::operator(), indices row col out of range\n");
      pfVar3 = &operator()(long,long)::zero;
    }
    else {
      pfVar3 = (this->fStorage).fStore +
               (row - lVar6) + (this->fBlockPos).fStore[lVar5] + (col - lVar6) * lVar4;
    }
  }
  return pfVar3;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}